

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# surface_mesh.cpp
# Opt level: O2

void __thiscall polyscope::SurfaceMesh::computeDefaultFaceTangentBasisX(SurfaceMesh *this)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  uint uVar5;
  long lVar6;
  pointer pvVar7;
  uint uVar8;
  ulong uVar9;
  long lVar10;
  float fVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar16 [56];
  undefined1 auVar14 [64];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  vec<3,_float,_(glm::qualifier)0> vVar20;
  vec3 N;
  vec<3,_float,_(glm::qualifier)0> local_80;
  vec<3,_float,_(glm::qualifier)0> local_70;
  vec<3,_float,_(glm::qualifier)0> local_60;
  string local_50;
  undefined8 uVar15;
  
  render::ManagedBuffer<glm::vec<3,_float,_(glm::qualifier)0>_>::ensureHostBufferPopulated
            (&this->vertexPositions);
  render::ManagedBuffer<glm::vec<3,_float,_(glm::qualifier)0>_>::ensureHostBufferPopulated
            (&this->faceNormals);
  std::
  vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
  ::resize((this->defaultFaceTangentBasisX).data,
           (*(long *)&(this->super_QuantityStructure<polyscope::SurfaceMesh>).field_0x430 -
            *(long *)&(this->super_QuantityStructure<polyscope::SurfaceMesh>).field_0x428 >> 2) - 1)
  ;
  lVar10 = 0;
  for (uVar9 = 0;
      lVar6 = *(long *)&(this->super_QuantityStructure<polyscope::SurfaceMesh>).field_0x428,
      uVar9 < (*(long *)&(this->super_QuantityStructure<polyscope::SurfaceMesh>).field_0x430 - lVar6
              >> 2) - 1U; uVar9 = uVar9 + 1) {
    uVar8 = *(uint *)(lVar6 + uVar9 * 4);
    if (*(int *)(lVar6 + 4 + uVar9 * 4) - uVar8 != 3) {
      std::__cxx11::string::string
                ((string *)&local_50,
                 "Default face tangent spaces only available for pure-triangular meshes",
                 (allocator *)&local_70);
      exception(&local_50);
      std::__cxx11::string::~string((string *)&local_50);
      uVar8 = *(uint *)(*(long *)&(this->super_QuantityStructure<polyscope::SurfaceMesh>).
                                  field_0x428 + uVar9 * 4);
    }
    lVar6 = *(long *)&(this->super_QuantityStructure<polyscope::SurfaceMesh>).field_0x440;
    uVar5 = *(uint *)(lVar6 + (ulong)uVar8 * 4);
    uVar8 = *(uint *)(lVar6 + 4 + (ulong)uVar8 * 4);
    pvVar7 = (((this->vertexPositions).data)->
             super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    uVar1 = pvVar7[uVar5].field_0;
    uVar3 = pvVar7[uVar5].field_1;
    auVar17._4_4_ = uVar3;
    auVar17._0_4_ = uVar1;
    auVar17._8_8_ = 0;
    uVar2 = pvVar7[uVar8].field_0;
    uVar4 = pvVar7[uVar8].field_1;
    auVar18._4_4_ = uVar4;
    auVar18._0_4_ = uVar2;
    auVar18._8_8_ = 0;
    local_80.field_2.z = pvVar7[uVar8].field_2.z - pvVar7[uVar5].field_2.z;
    pvVar7 = (((this->faceNormals).data)->
             super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    auVar12 = vsubps_avx(auVar18,auVar17);
    local_70.field_2 =
         (anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7)
         ((anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 *)
         ((long)&pvVar7->field_2 + lVar10))->z;
    local_70._0_8_ = *(undefined8 *)((long)&pvVar7->field_0 + lVar10);
    local_80._0_8_ = vmovlps_avx(auVar12);
    fVar11 = glm::detail::compute_dot<glm::vec<3,_float,_(glm::qualifier)0>,_float,_false>::call
                       (&local_70,&local_80);
    auVar19._8_8_ = 0;
    auVar19._0_4_ = local_80.field_0;
    auVar19._4_4_ = local_80.field_1;
    auVar12._0_4_ = fVar11 * local_70.field_0.x;
    auVar12._4_4_ = fVar11 * local_70.field_1.y;
    auVar12._8_4_ = fVar11 * 0.0;
    auVar12._12_4_ = fVar11 * 0.0;
    local_60.field_2.z = local_80.field_2.z - fVar11 * local_70.field_2.z;
    auVar12 = vsubps_avx(auVar19,auVar12);
    auVar16 = ZEXT856(auVar12._8_8_);
    local_60._0_8_ = vmovlps_avx(auVar12);
    vVar20 = glm::detail::compute_normalize<3,_float,_(glm::qualifier)0,_false>::call(&local_60);
    uVar15 = auVar16._0_8_;
    local_80.field_2 = vVar20.field_2;
    auVar14._0_8_ = vVar20._0_8_;
    auVar14._8_56_ = auVar16;
    local_80._0_8_ = vmovlps_avx(auVar14._0_16_);
    vVar20 = glm::detail::compute_cross<float,_(glm::qualifier)0,_false>::call(&local_80,&local_70);
    auVar13._0_8_ = vVar20._0_8_ ^ 0x8000000080000000;
    auVar13._8_4_ = (uint)uVar15 ^ 0x80000000;
    auVar13._12_4_ = (uint)((ulong)uVar15 >> 0x20) ^ 0x80000000;
    local_60.field_2.z = vVar20.field_2 ^ 0x80000000;
    local_60._0_8_ = vmovlps_avx(auVar13);
    glm::detail::compute_normalize<3,_float,_(glm::qualifier)0,_false>::call(&local_60);
    pvVar7 = (((this->defaultFaceTangentBasisX).data)->
             super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    *(anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 *)
     ((long)&pvVar7->field_2 + lVar10) = local_80.field_2;
    *(undefined8 *)((long)&pvVar7->field_0 + lVar10) = local_80._0_8_;
    lVar10 = lVar10 + 0xc;
  }
  render::ManagedBuffer<glm::vec<3,_float,_(glm::qualifier)0>_>::markHostBufferUpdated
            (&this->defaultFaceTangentBasisX);
  return;
}

Assistant:

void SurfaceMesh::computeDefaultFaceTangentBasisX() {

  // NOTE: this function is weirdly duplicated into an 'X' and 'Y' paradigm to fit the compute-function-per-buffer
  // paradigm

  vertexPositions.ensureHostBufferPopulated();
  faceNormals.ensureHostBufferPopulated();

  defaultFaceTangentBasisX.data.resize(nFaces());

  for (size_t iF = 0; iF < nFaces(); iF++) {
    size_t D = faceIndsStart[iF + 1] - faceIndsStart[iF];
    if (D != 3) exception("Default face tangent spaces only available for pure-triangular meshes");

    size_t start = faceIndsStart[iF];

    glm::vec3 pA = vertexPositions.data[faceIndsEntries[start + 0]];
    glm::vec3 pB = vertexPositions.data[faceIndsEntries[start + 1]];
    glm::vec3 N = faceNormals.data[iF];

    glm::vec3 basisX = pB - pA;
    basisX = glm::normalize(basisX - N * glm::dot(N, basisX));

    glm::vec3 basisY = glm::normalize(-glm::cross(basisX, N));

    defaultFaceTangentBasisX.data[iF] = basisX;
  }

  defaultFaceTangentBasisX.markHostBufferUpdated();
}